

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O0

void __thiscall
sc_core::sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::do_update
          (sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this)

{
  bool bVar1;
  sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *in_RDI;
  sc_event *in_stack_ffffffffffffffe8;
  
  sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::do_update(in_RDI);
  bVar1 = sc_dt::operator==(&in_RDI->m_cur_val,(sc_logic *)&sc_dt::SC_LOGIC_1);
  if (bVar1) {
    sc_signal_channel::notify_next_delta((sc_signal_channel *)in_RDI,in_stack_ffffffffffffffe8);
  }
  else {
    bVar1 = sc_dt::operator==(&in_RDI->m_cur_val,(sc_logic *)&sc_dt::SC_LOGIC_0);
    if (bVar1) {
      sc_signal_channel::notify_next_delta((sc_signal_channel *)in_RDI,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

void
sc_signal<sc_logic,POL>::do_update()
{
    base_type::do_update();

    if( this->m_cur_val == sc_dt::SC_LOGIC_1 ) {
        sc_signal_channel::notify_next_delta( m_posedge_event_p );
    }
    else if( this->m_cur_val == sc_dt::SC_LOGIC_0 ) {
        sc_signal_channel::notify_next_delta( m_negedge_event_p );
    }
}